

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

UChar * __thiscall icu_63::TZDBNames::getName(TZDBNames *this,UTimeZoneNameType type)

{
  UChar **ppUVar1;
  
  ppUVar1 = this->fNames;
  if (ppUVar1 == (UChar **)0x0) {
    return (UChar *)0x0;
  }
  if (type != UTZNM_SHORT_STANDARD) {
    if (type != UTZNM_SHORT_DAYLIGHT) {
      return (UChar *)0x0;
    }
    ppUVar1 = ppUVar1 + 1;
  }
  return *ppUVar1;
}

Assistant:

const UChar*
TZDBNames::getName(UTimeZoneNameType type) const {
    if (fNames == NULL) {
        return NULL;
    }
    const UChar *name = NULL;
    switch(type) {
    case UTZNM_SHORT_STANDARD:
        name = fNames[0];
        break;
    case UTZNM_SHORT_DAYLIGHT:
        name = fNames[1];
        break;
    default:
        name = NULL;
    }
    return name;
}